

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

void __thiscall
duckdb::RowMatcher::Initialize
          (RowMatcher *this,bool no_match_sel,TupleDataLayout *layout,Predicates *predicates,
          vector<unsigned_long,_true> *columns)

{
  reference pvVar1;
  const_reference type;
  const_reference pvVar2;
  ulong __n;
  MatchFunction local_50;
  
  ::std::vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>::reserve
            ((vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_> *)this,
             (long)(predicates->
                   super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>).
                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(predicates->
                   super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>).
                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  for (__n = 0; __n < (ulong)((long)(predicates->
                                    super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                    ).
                                    super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(predicates->
                                   super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                   ).
                                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                   ._M_impl.super__Vector_impl_data._M_start); __n = __n + 1) {
    pvVar1 = vector<unsigned_long,_true>::get<true>(columns,__n);
    type = vector<duckdb::LogicalType,_true>::get<true>(&layout->types,*pvVar1);
    pvVar2 = vector<duckdb::ExpressionType,_true>::get<true>(predicates,__n);
    GetMatchFunction(&local_50,this,no_match_sel,type,*pvVar2);
    ::std::vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>::
    emplace_back<duckdb::MatchFunction>
              ((vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_> *)this,
               &local_50);
    ::std::vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>::~vector
              (&local_50.child_functions.
                super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>);
  }
  return;
}

Assistant:

void RowMatcher::Initialize(const bool no_match_sel, const TupleDataLayout &layout, const Predicates &predicates,
                            vector<column_t> &columns) {

	// The columns must have the same size as the predicates vector
	D_ASSERT(columns.size() == predicates.size());

	// The largest column_id must be smaller than the number of types to not cause an out-of-bounds error
	D_ASSERT(*max_element(columns.begin(), columns.end()) < layout.GetTypes().size());

	match_functions.reserve(predicates.size());
	for (idx_t idx = 0; idx < predicates.size(); idx++) {
		column_t col_idx = columns[idx];
		match_functions.push_back(GetMatchFunction(no_match_sel, layout.GetTypes()[col_idx], predicates[idx]));
	}
}